

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_nearest_xyz(REF_NODE ref_node,REF_DBL *xyz,REF_INT *closest_node,REF_DBL *distance)

{
  REF_GLOB *pRVar1;
  REF_DBL *pRVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  REF_DBL RVar6;
  
  *closest_node = -1;
  *distance = 1e+100;
  if (0 < ref_node->max) {
    pRVar1 = ref_node->global;
    lVar3 = 2;
    lVar4 = 0;
    do {
      if (-1 < pRVar1[lVar4]) {
        pRVar2 = ref_node->real;
        dVar5 = (xyz[2] - pRVar2[lVar3]) * (xyz[2] - pRVar2[lVar3]) +
                (xyz[1] - pRVar2[lVar3 + -1]) * (xyz[1] - pRVar2[lVar3 + -1]) +
                (*xyz - pRVar2[lVar3 + -2]) * (*xyz - pRVar2[lVar3 + -2]);
        if (dVar5 < *distance) {
          *closest_node = (REF_INT)lVar4;
          *distance = dVar5;
        }
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xf;
    } while (lVar4 < ref_node->max);
  }
  dVar5 = *distance;
  if (dVar5 < 0.0) {
    RVar6 = sqrt(dVar5);
  }
  else {
    RVar6 = SQRT(dVar5);
  }
  *distance = RVar6;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_nearest_xyz(REF_NODE ref_node, REF_DBL *xyz,
                                        REF_INT *closest_node,
                                        REF_DBL *distance) {
  REF_INT node;
  REF_DBL dist;
  *closest_node = REF_EMPTY;
  *distance = 1.0e100;
  each_ref_node_valid_node(ref_node, node) {
    dist = pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
           pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
           pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2);
    if (dist < *distance) {
      *closest_node = node;
      *distance = dist;
    }
  }
  *distance = sqrt(*distance);
  return REF_SUCCESS;
}